

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPseudocost.h
# Opt level: O2

double __thiscall HighsPseudocost::getScoreUp(HighsPseudocost *this,HighsInt col,double frac)

{
  pointer pdVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  dVar4 = getPseudocostUp(this,col,frac);
  dVar5 = this->cost_total;
  if (dVar5 <= 1e-06) {
    dVar5 = 1e-06;
  }
  dVar7 = (double)(this->ncutoffsup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[col];
  dVar8 = (double)(this->nsamplesup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[col] + dVar7;
  if (dVar8 <= 1.0) {
    dVar8 = 1.0;
  }
  dVar9 = (double)this->nsamplestotal + (double)this->ncutoffstotal;
  if (dVar9 <= 1.0) {
    dVar9 = 1.0;
  }
  auVar6._8_8_ = (double)this->ncutoffstotal / dVar9;
  auVar6._0_8_ = this->inferences_total;
  pdVar1 = (this->conflictscoreup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)(this->conflictscoreup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
  lVar3 = lVar2 >> 3;
  auVar12._8_4_ = (int)(lVar2 >> 0x23);
  auVar12._0_8_ = lVar3;
  auVar12._12_4_ = 0x45300000;
  dVar9 = this->conflict_avg_score /
          (((auVar12._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) * this->conflict_weight);
  if (dVar9 <= 1e-06) {
    dVar9 = 1e-06;
  }
  auVar6 = maxpd(auVar6,_DAT_003ab1a0);
  auVar10._8_8_ = dVar7 / dVar8;
  auVar10._0_8_ =
       (this->inferencesup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[col];
  auVar6 = divpd(auVar10,auVar6);
  auVar11._0_8_ = auVar6._0_8_ + (double)DAT_0039d5d0;
  auVar11._8_8_ = auVar6._8_8_ + DAT_0039d5d0._8_8_;
  auVar6 = divpd(_DAT_0039d5d0,auVar11);
  return (1.0 - 1.0 / ((pdVar1[col] / this->conflict_weight) / dVar9 + 1.0)) * 0.01 +
         ((DAT_0039d5d0._8_8_ - auVar6._8_8_) + ((double)DAT_0039d5d0 - auVar6._0_8_)) * 0.0001 +
         (1.0 - 1.0 / (dVar4 / dVar5 + 1.0));
}

Assistant:

double getScoreUp(HighsInt col, double frac) const {
    double costScore = getPseudocostUp(col, frac) / std::max(1e-6, cost_total);
    double inferenceScore =
        inferencesup[col] / std::max(1e-6, inferences_total);

    double cutOffScoreUp =
        ncutoffsup[col] /
        std::max(1.0, static_cast<double>(ncutoffsup[col]) +
                          static_cast<double>(nsamplesup[col]));
    double avgCutoffs = static_cast<double>(ncutoffstotal) /
                        std::max(1.0, static_cast<double>(ncutoffstotal) +
                                          static_cast<double>(nsamplestotal));

    double cutoffScore = cutOffScoreUp / std::max(1e-6, avgCutoffs);

    double conflictScoreUp = conflictscoreup[col] / conflict_weight;
    double conflictScoreAvg =
        conflict_avg_score /
        (conflict_weight * static_cast<double>(conflictscoreup.size()));
    double conflictScore = conflictScoreUp / std::max(1e-6, conflictScoreAvg);

    auto mapScore = [](double score) { return 1.0 - 1.0 / (1.0 + score); };

    return mapScore(costScore) +
           (1e-2 * mapScore(conflictScore) +
            1e-4 * (mapScore(cutoffScore) + mapScore(inferenceScore)));
  }